

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  XML *this_00;
  _Alloc_hider _Var2;
  Ref<embree::SceneGraph::MaterialNode> RVar3;
  undefined8 uVar4;
  bool bVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  CurveSubtype subtype;
  size_t *in_RDX;
  char *pcVar10;
  Ref<embree::XML> *xml_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  string *psVar11;
  Node *pNVar12;
  string str_subtype;
  string id;
  string id_2;
  Ref<embree::SceneGraph::MaterialNode> material;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  allocator local_89;
  undefined1 local_88 [48];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  
  this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&str_subtype;
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*in_RDX + 0x30),"assign");
  if (bVar5) {
    pXVar1 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)&id_2,"type",(allocator *)&str_subtype);
    XML::parm(&id,pXVar1,&id_2);
    bVar5 = std::operator==(&id,"material");
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::string::~string((string *)&id_2);
    if (bVar5) {
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&id_2,"id",(allocator *)&str_subtype);
      XML::parm(&id,pXVar1,&id_2);
      std::__cxx11::string::~string((string *)&id_2);
      XML::child((XML *)&id_2,*in_RDX);
      loadMaterial((XMLLoader *)&material,xml);
      if (id_2._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)id_2._M_dataplus._M_p + 0x18))();
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,&id);
      RVar3 = material;
      if (material.ptr != (MaterialNode *)0x0) {
        (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(material.ptr);
      }
      if (pmVar6->ptr != (MaterialNode *)0x0) {
        (*(pmVar6->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar6->ptr = RVar3.ptr;
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string
                ((string *)&str_subtype,"name",(allocator *)local_b0[0]._M_local_buf);
      XML::parm(&id_2,pXVar1,&str_subtype);
      std::__cxx11::string::operator=((string *)&((RVar3.ptr)->super_Node).name,(string *)&id_2);
      std::__cxx11::string::~string((string *)&id_2);
      std::__cxx11::string::~string((string *)&str_subtype);
      (this->path).filename._M_dataplus._M_p = (pointer)0x0;
      if (RVar3.ptr != (MaterialNode *)0x0) {
        (*((RVar3.ptr)->super_Node).super_RefCount._vptr_RefCount[3])(RVar3.ptr);
      }
    }
    else {
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&id_2,"type",(allocator *)&str_subtype);
      XML::parm(&id,pXVar1,&id_2);
      bVar5 = std::operator==(&id,"scene");
      std::__cxx11::string::~string((string *)&id);
      std::__cxx11::string::~string((string *)&id_2);
      if (!bVar5) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&str_subtype,(ParseLocation *)(*in_RDX + 0x10));
        std::operator+(&id_2,&str_subtype,": unknown type: ");
        pXVar1 = (XML *)*in_RDX;
        std::__cxx11::string::string
                  ((string *)local_b0[0]._M_local_buf,"type",(allocator *)local_88);
        XML::parm((string *)&material,pXVar1,(string *)local_b0);
        std::operator+(&id,&id_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &material);
        std::runtime_error::runtime_error(prVar9,(string *)&id);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&id_2,"id",(allocator *)&str_subtype);
      XML::parm(&id,pXVar1,&id_2);
      std::__cxx11::string::~string((string *)&id_2);
      XML::child((XML *)&str_subtype,*in_RDX);
      loadNode((XMLLoader *)&id_2,xml);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id);
      if (pmVar7->ptr != (Node *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = (Node *)id_2._M_dataplus._M_p;
      id_2._M_dataplus._M_p = (pointer)0x0;
      if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)0x0;
    }
    psVar11 = &id;
    goto LAB_00179420;
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&id,"id",(allocator *)&str_subtype);
  XML::parm(&id_2,pXVar1,&id);
  std::__cxx11::string::~string((string *)&id);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*in_RDX + 0x30),"extern");
  if (bVar5) {
    pXVar1 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)&material,"src",(allocator *)local_88);
    XML::parm(&str_subtype,pXVar1,(string *)&material);
    FileName::operator+((FileName *)&id,(FileName *)xml,&str_subtype);
    SceneGraph::load((SceneGraph *)local_b0[0]._M_local_buf,(FileName *)&id,false);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,&id_2);
    if (pmVar7->ptr != (Node *)0x0) {
      (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar7->ptr = (Node *)local_b0[0]._0_8_;
    local_b0[0]._M_allocated_capacity = (Node *)0x0;
    if (pmVar7->ptr == (Node *)0x0) goto LAB_00179382;
    (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
    pNVar12 = pmVar7->ptr;
    (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
    if ((Node *)local_b0[0]._0_8_ != (Node *)0x0) {
      (**(code **)(*(long *)local_b0[0]._0_8_ + 0x18))();
    }
    goto LAB_00179389;
  }
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*in_RDX + 0x30),"xml");
  if (bVar5) {
    pXVar1 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_b0[0]._M_local_buf,"src",&local_89);
    XML::parm((string *)&material,pXVar1,(string *)local_b0);
    FileName::operator+((FileName *)&str_subtype,(FileName *)xml,(string *)&material);
    id._M_dataplus._M_p = (pointer)0x3f800000;
    id._M_string_length = 0;
    id.field_2._M_allocated_capacity = 0x3f80000000000000;
    id.field_2._8_8_ = 0;
    load((XMLLoader *)local_88,(FileName *)&str_subtype,(AffineSpace3fa *)&id,
         (SharedState *)xml[10].ptr);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,&id_2);
    if (pmVar7->ptr != (Node *)0x0) {
      (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    uVar4 = local_88._0_8_;
    pmVar7->ptr = (Node *)local_88._0_8_;
    local_88._0_8_ = (Node *)0x0;
    if ((Node *)uVar4 == (Node *)0x0) {
      pNVar12 = (Node *)0x0;
    }
    else {
      (**(code **)(*(long *)uVar4 + 0x10))();
      pNVar12 = pmVar7->ptr;
    }
    (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
    std::__cxx11::string::~string((string *)&str_subtype);
    std::__cxx11::string::~string((string *)&material);
    this_01 = local_b0;
LAB_001793c8:
    std::__cxx11::string::~string((string *)this_01->_M_local_buf);
  }
  else {
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"extern_combine");
    if (bVar5) {
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&material,"src",(allocator *)local_88);
      XML::parm(&str_subtype,pXVar1,(string *)&material);
      FileName::operator+((FileName *)&id,(FileName *)xml,&str_subtype);
      SceneGraph::load((SceneGraph *)local_b0[0]._M_local_buf,(FileName *)&id,true);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id_2);
      if (pmVar7->ptr != (Node *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = (Node *)local_b0[0]._0_8_;
      local_b0[0]._M_allocated_capacity = (Node *)0x0;
      if (pmVar7->ptr == (Node *)0x0) {
LAB_00179382:
        local_b0[0]._M_allocated_capacity = (Node *)0x0;
        (this->path).filename._M_dataplus._M_p = (pointer)0x0;
        pNVar12 = (Node *)0x0;
      }
      else {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
        pNVar12 = pmVar7->ptr;
        (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
        if ((Node *)local_b0[0]._0_8_ != (Node *)0x0) {
          (**(code **)(*(long *)local_b0[0]._0_8_ + 0x18))();
        }
      }
LAB_00179389:
      std::__cxx11::string::~string((string *)&id);
      std::__cxx11::string::~string((string *)&str_subtype);
      this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&material;
      goto LAB_001793c8;
    }
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"obj");
    if (bVar5) {
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&str_subtype,"subdiv",(allocator *)&material);
      XML::parm(&id,pXVar1,&str_subtype);
      bVar5 = std::operator==(&id,"1");
      std::__cxx11::string::~string((string *)&id);
      std::__cxx11::string::~string((string *)&str_subtype);
      pXVar1 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&material,"src",(allocator *)local_88);
      XML::parm(&str_subtype,pXVar1,(string *)&material);
      FileName::operator+((FileName *)&id,(FileName *)xml,&str_subtype);
      loadOBJ((embree *)local_b0[0]._M_local_buf,(FileName *)&id,bVar5,false);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id_2);
      if (pmVar7->ptr != (Node *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = (Node *)local_b0[0]._0_8_;
      local_b0[0]._M_allocated_capacity = (Node *)0x0;
      if (pmVar7->ptr == (Node *)0x0) goto LAB_00179382;
      (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
      pNVar12 = pmVar7->ptr;
      (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
      if ((Node *)local_b0[0]._0_8_ != (Node *)0x0) {
        (**(code **)(*(long *)local_b0[0]._0_8_ + 0x18))();
      }
      goto LAB_00179389;
    }
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"ref");
    if (bVar5) {
      pXVar1 = xml[10].ptr;
      this_00 = (XML *)*in_RDX;
      std::__cxx11::string::string((string *)&str_subtype,"id",(allocator *)&material);
      XML::parm(&id,this_00,&str_subtype);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&(pXVar1->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id_2);
      if (pmVar7->ptr != (Node *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar8->ptr != (Node *)0x0) {
        (*(pmVar8->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pNVar12 = pmVar7->ptr;
      pmVar8->ptr = pNVar12;
      if (pNVar12 == (Node *)0x0) {
        pNVar12 = (Node *)0x0;
      }
      else {
        (*(pNVar12->super_RefCount)._vptr_RefCount[2])();
        pNVar12 = pmVar8->ptr;
      }
      (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
      std::__cxx11::string::~string((string *)&id);
      goto LAB_001793c8;
    }
    pcVar10 = "PointLight";
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"PointLight");
    if (bVar5) {
      loadPointLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id_2);
      if (pmVar7->ptr != (Node *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      _Var2._M_p = id._M_dataplus._M_p;
      pmVar7->ptr = (Node *)id._M_dataplus._M_p;
      id._M_dataplus._M_p = (pointer)0x0;
      if (_Var2._M_p != (pointer)0x0) {
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
LAB_0017a624:
      id._M_dataplus._M_p = (pointer)0x0;
      pNVar12 = (Node *)0x0;
LAB_0017a627:
      (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
    }
    else {
      pcVar10 = "SpotLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"SpotLight");
      if (bVar5) {
        loadSpotLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      pcVar10 = "DirectionalLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"DirectionalLight");
      if (bVar5) {
        loadDirectionalLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      pcVar10 = "DistantLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"DistantLight");
      if (bVar5) {
        loadDistantLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      pcVar10 = "AmbientLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"AmbientLight");
      if (bVar5) {
        loadAmbientLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      pcVar10 = "TriangleLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"TriangleLight");
      if (bVar5) {
        loadTriangleLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"AnimatedLight");
      if (bVar5) {
        loadAnimatedLight((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      pcVar10 = "QuadLight";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"QuadLight");
      if (bVar5) {
        loadQuadLight((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"TriangleMesh");
      if (bVar5) {
        loadTriangleMesh((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"QuadMesh");
      if (bVar5) {
        loadQuadMesh((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"GridMesh");
      if (bVar5) {
        loadGridMesh((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"SubdivisionMesh");
      if (bVar5) {
        loadSubdivMesh((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Hair");
      subtype = (CurveSubtype)in_RDX;
      if (bVar5) {
        loadBezierCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"LineSegments");
      if (bVar5) {
        loadCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"RoundLineSegments");
      if (bVar5) {
        loadCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"ConeSegments");
      if (bVar5) {
        loadCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"BezierHair");
      if (bVar5) {
        loadBezierCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"BSplineHair");
      if (bVar5) {
        loadCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"BezierCurves");
      if (bVar5) {
        loadBezierCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"BSplineCurves");
      if (bVar5) {
        loadCurves((XMLLoader *)&id,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
          goto LAB_00179e16;
        }
        goto LAB_0017a624;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Points");
      if (bVar5) {
        pXVar1 = (XML *)*in_RDX;
        std::__cxx11::string::string((string *)&str_subtype,"type",(allocator *)&material);
        XML::parm(&id,pXVar1,&str_subtype);
        std::__cxx11::string::~string((string *)&str_subtype);
        bVar5 = std::operator==(&id,"sphere");
        if (((!bVar5) && (bVar5 = std::operator==(&id,"disc"), !bVar5)) &&
           (bVar5 = std::operator==(&id,"oriented"), !bVar5)) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_((string *)local_b0,(ParseLocation *)(*in_RDX + 0x10));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &material,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,": unknown point type: ");
          std::operator+(&str_subtype,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &material,&id);
          std::runtime_error::runtime_error(prVar9,(string *)&str_subtype);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        loadPoints((XMLLoader *)&str_subtype,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = str_subtype._M_dataplus._M_p;
        pmVar7->ptr = (Node *)str_subtype._M_dataplus._M_p;
        str_subtype._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
        }
        pNVar12 = pmVar7->ptr;
        (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
LAB_0017a233:
        this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&id;
        goto LAB_001793c8;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Curves");
      if (bVar5) {
        pXVar1 = (XML *)*in_RDX;
        std::__cxx11::string::string((string *)&str_subtype,"basis",(allocator *)&material);
        XML::parm(&id,pXVar1,&str_subtype);
        std::__cxx11::string::~string((string *)&str_subtype);
        pXVar1 = (XML *)*in_RDX;
        std::__cxx11::string::string
                  ((string *)&material,"type",(allocator *)local_b0[0]._M_local_buf);
        XML::parm(&str_subtype,pXVar1,(string *)&material);
        std::__cxx11::string::~string((string *)&material);
        bVar5 = std::operator==(&id,"linear");
        if (bVar5) {
          bVar5 = std::operator==(&str_subtype,"flat");
          if ((!bVar5) && (bVar5 = std::operator==(&str_subtype,"round"), !bVar5)) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            ParseLocation::str_abi_cxx11_((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88,": unknown curve type: ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &material,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,&str_subtype);
            std::runtime_error::runtime_error(prVar9,(string *)&material);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          bVar5 = std::operator==(&id,"bezier");
          if (bVar5) {
            bVar5 = std::operator==(&str_subtype,"flat");
            if ((((!bVar5) && (bVar5 = std::operator==(&str_subtype,"ribbon"), !bVar5)) &&
                (bVar5 = std::operator==(&str_subtype,"round"), !bVar5)) &&
               ((bVar5 = std::operator==(&str_subtype,"surface"), !bVar5 &&
                (bVar5 = std::operator==(&str_subtype,"normal_oriented"), !bVar5)))) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              ParseLocation::str_abi_cxx11_((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_88,": unknown curve type: ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &material,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b0,&str_subtype);
              std::runtime_error::runtime_error(prVar9,(string *)&material);
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            bVar5 = std::operator==(&id,"bspline");
            if (bVar5) {
              bVar5 = std::operator==(&str_subtype,"flat");
              if (((!bVar5) && (bVar5 = std::operator==(&str_subtype,"ribbon"), !bVar5)) &&
                 ((bVar5 = std::operator==(&str_subtype,"round"), !bVar5 &&
                  ((bVar5 = std::operator==(&str_subtype,"surface"), !bVar5 &&
                   (bVar5 = std::operator==(&str_subtype,"normal_oriented"), !bVar5)))))) {
                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                ParseLocation::str_abi_cxx11_((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_88,": unknown curve type: ");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &material,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,&str_subtype);
                std::runtime_error::runtime_error(prVar9,(string *)&material);
                __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              bVar5 = std::operator==(&id,"hermite");
              if (bVar5) {
                bVar5 = std::operator==(&str_subtype,"flat");
                if ((((!bVar5) && (bVar5 = std::operator==(&str_subtype,"ribbon"), !bVar5)) &&
                    (bVar5 = std::operator==(&str_subtype,"round"), !bVar5)) &&
                   ((bVar5 = std::operator==(&str_subtype,"surface"), !bVar5 &&
                    (bVar5 = std::operator==(&str_subtype,"normal_oriented"), !bVar5)))) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_
                            ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,": unknown curve type: ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&material,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&str_subtype);
                  std::runtime_error::runtime_error(prVar9,(string *)&material);
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                bVar5 = std::operator==(&id,"catmull_rom");
                if (!bVar5) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_
                            ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,": unknown curve basis: ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&material,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&id);
                  std::runtime_error::runtime_error(prVar9,(string *)&material);
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                bVar5 = std::operator==(&str_subtype,"flat");
                if (((!bVar5) && (bVar5 = std::operator==(&str_subtype,"ribbon"), !bVar5)) &&
                   ((bVar5 = std::operator==(&str_subtype,"round"), !bVar5 &&
                    ((bVar5 = std::operator==(&str_subtype,"surface"), !bVar5 &&
                     (bVar5 = std::operator==(&str_subtype,"normal_oriented"), !bVar5)))))) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_
                            ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,": unknown curve type: ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&material,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&str_subtype);
                  std::runtime_error::runtime_error(prVar9,(string *)&material);
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
        loadCurves((XMLLoader *)&material,xml,subtype);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        RVar3.ptr = material.ptr;
        pmVar7->ptr = &(material.ptr)->super_Node;
        material.ptr = (MaterialNode *)0x0;
        if (RVar3.ptr != (MaterialNode *)0x0) {
          (*((RVar3.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
        }
        pNVar12 = pmVar7->ptr;
        (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
        std::__cxx11::string::~string((string *)&str_subtype);
        goto LAB_0017a233;
      }
      xml_00 = (Ref<embree::XML> *)0x224cbe;
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"PerspectiveCamera");
      if (bVar5) {
        loadPerspectiveCamera((XMLLoader *)&id,xml_00);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
LAB_00179e16:
        pNVar12 = pmVar7->ptr;
        goto LAB_0017a627;
      }
      pcVar10 = "AnimatedPerspectiveCamera";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"AnimatedPerspectiveCamera");
      if (bVar5) {
        loadAnimatedPerspectiveCamera((XMLLoader *)&id,(Ref<embree::XML> *)pcVar10);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Group");
      if (bVar5) {
        loadGroupNode((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Transform");
      if (bVar5) {
        loadTransformNode((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"MultiTransform");
      if (bVar5) {
        loadMultiTransformNode((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Transform2");
      if (bVar5) {
        loadTransform2Node((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"TransformAnimation");
      if (bVar5) {
        loadTransformAnimationNode((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Animation2");
      if (bVar5) {
        loadAnimation2Node((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p == (pointer)0x0) goto LAB_0017a624;
        (**(code **)(*(long *)_Var2._M_p + 0x10))();
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Animation");
      if (bVar5) {
        loadAnimationNode((XMLLoader *)&id,xml);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        _Var2._M_p = id._M_dataplus._M_p;
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (_Var2._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var2._M_p + 0x10))();
        }
        goto LAB_00179e16;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"ConvertTrianglesToQuads");
      if (bVar5) {
        XML::child((XML *)&str_subtype,*in_RDX);
        loadNode((XMLLoader *)(local_40 + 8),xml);
        SceneGraph::convert_triangles_to_quads
                  ((SceneGraph *)&id,(Ref<embree::SceneGraph::Node> *)(local_40 + 8),INFINITY);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id_2);
        if (pmVar7->ptr != (Node *)0x0) {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar7->ptr = (Node *)id._M_dataplus._M_p;
        id._M_dataplus._M_p = (pointer)0x0;
        if (pmVar7->ptr == (Node *)0x0) {
          pNVar12 = pmVar7->ptr;
          (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
        }
        else {
          (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
          pNVar12 = pmVar7->ptr;
          (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
          if (id._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
          }
        }
        if ((SharedState *)local_40._8_8_ != (SharedState *)0x0) {
          (**(code **)(*(long *)local_40._8_8_ + 0x18))();
        }
        if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
        }
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*in_RDX + 0x30),"ConvertTrianglesToTrianglesAndQuads");
        if (bVar5) {
          XML::child((XML *)&str_subtype,*in_RDX);
          loadNode((XMLLoader *)local_40,xml);
          SceneGraph::convert_triangles_to_quads
                    ((SceneGraph *)&id,(Ref<embree::SceneGraph::Node> *)local_40,0.5);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,&id_2);
          if (pmVar7->ptr != (Node *)0x0) {
            (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pmVar7->ptr = (Node *)id._M_dataplus._M_p;
          id._M_dataplus._M_p = (pointer)0x0;
          if (pmVar7->ptr == (Node *)0x0) {
            pNVar12 = pmVar7->ptr;
            (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
          }
          else {
            (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
            pNVar12 = pmVar7->ptr;
            (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
            if (id._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
            }
          }
          if ((_Base_ptr)local_40._0_8_ != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_40._0_8_ + 0x18))();
          }
          if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
          }
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*in_RDX + 0x30),"ConvertQuadsToSubdivs");
          if (bVar5) {
            XML::child((XML *)&str_subtype,*in_RDX);
            loadNode((XMLLoader *)local_48,xml);
            SceneGraph::convert_quads_to_subdivs
                      ((SceneGraph *)&id,(Ref<embree::SceneGraph::Node> *)local_48);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                   *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,&id_2);
            if (pmVar7->ptr != (Node *)0x0) {
              (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
            }
            pmVar7->ptr = (Node *)id._M_dataplus._M_p;
            id._M_dataplus._M_p = (pointer)0x0;
            if (pmVar7->ptr == (Node *)0x0) {
              pNVar12 = pmVar7->ptr;
              (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
            }
            else {
              (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
              pNVar12 = pmVar7->ptr;
              (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
              if (id._M_dataplus._M_p != (pointer)0x0) {
                (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
              }
            }
            if (local_48 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_48 + 0x18))();
            }
            if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
            }
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(*in_RDX + 0x30),"ConvertBezierToLines");
            if (bVar5) {
              XML::child((XML *)&str_subtype,*in_RDX);
              loadNode((XMLLoader *)local_50,xml);
              SceneGraph::convert_bezier_to_lines
                        ((SceneGraph *)&id,(Ref<embree::SceneGraph::Node> *)local_50);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                     *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent,&id_2);
              if (pmVar7->ptr != (Node *)0x0) {
                (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
              }
              pmVar7->ptr = (Node *)id._M_dataplus._M_p;
              id._M_dataplus._M_p = (pointer)0x0;
              if (pmVar7->ptr == (Node *)0x0) {
                pNVar12 = pmVar7->ptr;
                (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
              }
              else {
                (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
                pNVar12 = pmVar7->ptr;
                (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                if (id._M_dataplus._M_p != (pointer)0x0) {
                  (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
                }
              }
              if (local_50 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_50 + 0x18))();
              }
              if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
                (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
              }
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(*in_RDX + 0x30),"ConvertHairToCurves");
              if (bVar5) {
                XML::child((XML *)&str_subtype,*in_RDX);
                loadNode((XMLLoader *)local_58,xml);
                SceneGraph::convert_flat_to_round_curves
                          ((SceneGraph *)&id,(Ref<embree::SceneGraph::Node> *)local_58);
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,&id_2);
                if (pmVar7->ptr != (Node *)0x0) {
                  (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                pmVar7->ptr = (Node *)id._M_dataplus._M_p;
                id._M_dataplus._M_p = (pointer)0x0;
                if (pmVar7->ptr == (Node *)0x0) {
                  pNVar12 = pmVar7->ptr;
                  (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                }
                else {
                  (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
                  pNVar12 = pmVar7->ptr;
                  (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                  if (id._M_dataplus._M_p != (pointer)0x0) {
                    (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
                  }
                }
                if (local_58 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_58 + 0x18))();
                }
                if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
                  (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
                }
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(*in_RDX + 0x30),"Flatten");
                if (bVar5) {
                  XML::child((XML *)&str_subtype,*in_RDX);
                  loadNode((XMLLoader *)(local_88 + 0x28),xml);
                  SceneGraph::flatten((SceneGraph *)&id,
                                      (Ref<embree::SceneGraph::Node> *)(local_88 + 0x28),
                                      INSTANCING_NONE);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                         *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_parent,&id_2);
                  if (pmVar7->ptr != (Node *)0x0) {
                    (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
                  }
                  pmVar7->ptr = (Node *)id._M_dataplus._M_p;
                  id._M_dataplus._M_p = (pointer)0x0;
                  if (pmVar7->ptr == (Node *)0x0) {
                    pNVar12 = pmVar7->ptr;
                    (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                  }
                  else {
                    (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[2])();
                    pNVar12 = pmVar7->ptr;
                    (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                    if (id._M_dataplus._M_p != (pointer)0x0) {
                      (**(code **)(*(long *)id._M_dataplus._M_p + 0x18))();
                    }
                  }
                  if ((_Base_ptr)local_88._40_8_ != (_Base_ptr)0x0) {
                    (*(code *)((*(XML **)local_88._40_8_)->loc).fileName.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)();
                  }
                  if (str_subtype._M_dataplus._M_p != (pointer)0x0) {
                    (**(code **)(*(long *)str_subtype._M_dataplus._M_p + 0x18))();
                  }
                }
                else {
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(*in_RDX + 0x30),"TimeRange");
                  if (!bVar5) {
                    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(*in_RDX + 0x30),"FurBall");
                    if (!bVar5) {
                      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ParseLocation::str_abi_cxx11_
                                ((string *)&material,(ParseLocation *)(*in_RDX + 0x10));
                      std::operator+(&str_subtype,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&material,": unknown tag: ");
                      std::operator+(&id,&str_subtype,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(*in_RDX + 0x30));
                      std::runtime_error::runtime_error(prVar9,(string *)&id);
                      __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    loadFurBall((XMLLoader *)&id,xml);
                    pmVar7 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                           *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_parent,&id_2);
                    if (pmVar7->ptr != (Node *)0x0) {
                      (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
                    }
                    _Var2._M_p = id._M_dataplus._M_p;
                    pmVar7->ptr = (Node *)id._M_dataplus._M_p;
                    id._M_dataplus._M_p = (pointer)0x0;
                    if (_Var2._M_p != (pointer)0x0) {
                      (**(code **)(*(long *)_Var2._M_p + 0x10))();
                    }
                    goto LAB_00179e16;
                  }
                  psVar11 = (string *)*in_RDX;
                  std::__cxx11::string::string((string *)&id,"time",(allocator *)&material);
                  XML::parm_Vec2f((XML *)&str_subtype,psVar11);
                  std::__cxx11::string::~string((string *)&id);
                  XML::child((XML *)&material,*in_RDX);
                  loadNode((XMLLoader *)&id,xml);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                         *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_parent,&id_2);
                  if (pmVar7->ptr != (Node *)0x0) {
                    (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
                  }
                  _Var2._M_p = id._M_dataplus._M_p;
                  pmVar7->ptr = (Node *)id._M_dataplus._M_p;
                  id._M_dataplus._M_p = (pointer)0x0;
                  if (_Var2._M_p == (pointer)0x0) {
                    pNVar12 = (Node *)0x0;
                  }
                  else {
                    (**(code **)(*(long *)_Var2._M_p + 0x10))();
                    pNVar12 = pmVar7->ptr;
                  }
                  (this->path).filename._M_dataplus._M_p = (pointer)pNVar12;
                  if (material.ptr != (MaterialNode *)0x0) {
                    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                  }
                  local_88._32_8_ = pNVar12;
                  if (pNVar12 != (Node *)0x0) {
                    (*(pNVar12->super_RefCount)._vptr_RefCount[2])(pNVar12);
                  }
                  id._M_dataplus = str_subtype._M_dataplus;
                  SceneGraph::set_time_range
                            ((Ref<embree::SceneGraph::Node> *)(local_88 + 0x20),(BBox1f *)&id);
                  if ((Node *)local_88._32_8_ != (Node *)0x0) {
                    (*((RefCount *)local_88._32_8_)->_vptr_RefCount[3])();
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&str_subtype,"name",(allocator *)&material);
  XML::parm(&id,pXVar1,&str_subtype);
  std::__cxx11::string::operator=((string *)&pNVar12->name,(string *)&id);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&str_subtype);
  psVar11 = &id_2;
LAB_00179420:
  std::__cxx11::string::~string((string *)psVar11);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadNode(const Ref<XML>& xml)
  {
    if (xml->name == "assign") 
    {
      if (xml->parm("type") == "material") 
      {
        const std::string id = xml->parm("id");
        Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child(0));
        state.materialMap[id] = material;
        material->name = xml->parm("name");
        return nullptr;
      }
      else if (xml->parm("type") == "scene")
      {
        const std::string id = xml->parm("id");
        state.sceneMap[id] = loadNode(xml->child(0));
        return nullptr;
      }
      else 
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown type: "+xml->parm("type"));
    }
    else 
    {
      Ref<SceneGraph::Node> node = nullptr;
      const std::string id = xml->parm("id");
      if (xml->name == "extern") 
        node = state.sceneMap[id] = SceneGraph::load(path + xml->parm("src"));
      else if (xml->name == "xml")
        node = state.sceneMap[id] = XMLLoader::load(path + xml->parm("src"),one,state);
      else if (xml->name == "extern_combine") 
        node = state.sceneMap[id] = SceneGraph::load(path + xml->parm("src"),true);
      else if (xml->name == "obj"             ) {
        const bool subdiv_mode = xml->parm("subdiv") == "1";
        node = state.sceneMap[id] = loadOBJ(path + xml->parm("src"),subdiv_mode);
      }

      else if (xml->name == "ref"             ) node = state.sceneMap[id] = state.sceneMap[xml->parm("id")];
      else if (xml->name == "PointLight"      ) node = state.sceneMap[id] = loadPointLight      (xml);
      else if (xml->name == "SpotLight"       ) node = state.sceneMap[id] = loadSpotLight       (xml);
      else if (xml->name == "DirectionalLight") node = state.sceneMap[id] = loadDirectionalLight(xml);
      else if (xml->name == "DistantLight"    ) node = state.sceneMap[id] = loadDistantLight    (xml);
      else if (xml->name == "AmbientLight"    ) node = state.sceneMap[id] = loadAmbientLight    (xml);
      else if (xml->name == "TriangleLight"   ) node = state.sceneMap[id] = loadTriangleLight   (xml);
      else if (xml->name == "AnimatedLight"   ) node = state.sceneMap[id] = loadAnimatedLight   (xml);
      else if (xml->name == "QuadLight"       ) node = state.sceneMap[id] = loadQuadLight       (xml);
      else if (xml->name == "TriangleMesh"    ) node = state.sceneMap[id] = loadTriangleMesh    (xml);
      else if (xml->name == "QuadMesh"        ) node = state.sceneMap[id] = loadQuadMesh        (xml);
      else if (xml->name == "GridMesh"        ) node = state.sceneMap[id] = loadGridMesh        (xml);
      else if (xml->name == "SubdivisionMesh" ) node = state.sceneMap[id] = loadSubdivMesh      (xml);

      /* just for compatibility, use Curves XML node instead */
      else if (xml->name == "Hair"             ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::FLAT_CURVE);
      else if (xml->name == "LineSegments"     ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE);
      else if (xml->name == "RoundLineSegments") node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE);
      else if (xml->name == "ConeSegments")      node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_CONE_LINEAR_CURVE);
      else if (xml->name == "BezierHair"       ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::FLAT_CURVE);
      else if (xml->name == "BSplineHair"      ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE);
      else if (xml->name == "BezierCurves"     ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::ROUND_CURVE);
      else if (xml->name == "BSplineCurves"    ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE);

      else if (xml->name == "Points")
      {
        RTCGeometryType type;
        std::string str_type = xml->parm("type");
        if      (str_type == "sphere")   { type = RTC_GEOMETRY_TYPE_SPHERE_POINT; }
        else if (str_type == "disc")     { type = RTC_GEOMETRY_TYPE_DISC_POINT; }
        else if (str_type == "oriented") { type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT; }
        else { THROW_RUNTIME_ERROR(xml->loc.str()+": unknown point type: "+str_type); }
        node = state.sceneMap[id] = loadPoints(xml,type);
      }

      else if (xml->name == "Curves")
      {
        RTCGeometryType type;
        std::string str_type = xml->parm("basis");
        std::string str_subtype = xml->parm("type");
        if (str_type == "linear")
        {
          if (str_subtype == "flat")
            type = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;
          else if (str_subtype == "round")
            type = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;
          //else if (str_subtype == "normal_oriented")
          //  type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_LINEAR_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "bezier")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
          else if (str_subtype == "round" || str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "bspline")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
          else if (str_subtype == "round" ||str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "hermite")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
          else if (str_subtype == "round" ||str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "catmull_rom")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;
          else if (str_subtype == "round" || str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else
          THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve basis: "+str_type);
        
        node = state.sceneMap[id] = loadCurves(xml,type);
      }
      else if (xml->name == "PerspectiveCamera") node = state.sceneMap[id] = loadPerspectiveCamera(xml);
      else if (xml->name == "AnimatedPerspectiveCamera") node = state.sceneMap[id] = loadAnimatedPerspectiveCamera(xml);
      else if (xml->name == "Group"           ) node = state.sceneMap[id] = loadGroupNode       (xml);
      else if (xml->name == "Transform"       ) node = state.sceneMap[id] = loadTransformNode   (xml);
      else if (xml->name == "MultiTransform"  ) node = state.sceneMap[id] = loadMultiTransformNode(xml);
      else if (xml->name == "Transform2"      ) node = state.sceneMap[id] = loadTransform2Node  (xml);
      else if (xml->name == "TransformAnimation") node = state.sceneMap[id] = loadTransformAnimationNode(xml);
      else if (xml->name == "Animation2"      ) node = state.sceneMap[id] = loadAnimation2Node  (xml);
      else if (xml->name == "Animation"       ) node = state.sceneMap[id] = loadAnimationNode   (xml);

      else if (xml->name == "ConvertTrianglesToQuads") node = state.sceneMap[id] = convert_triangles_to_quads(loadNode(xml->child(0)),inf);
      else if (xml->name == "ConvertTrianglesToTrianglesAndQuads") node = state.sceneMap[id] = convert_triangles_to_quads(loadNode(xml->child(0)),0.5f);
      else if (xml->name == "ConvertQuadsToSubdivs"  ) node = state.sceneMap[id] = convert_quads_to_subdivs  (loadNode(xml->child(0)));
      else if (xml->name == "ConvertBezierToLines"   ) node = state.sceneMap[id] = convert_bezier_to_lines   (loadNode(xml->child(0)));
      else if (xml->name == "ConvertHairToCurves"    ) node = state.sceneMap[id] = convert_flat_to_round_curves(loadNode(xml->child(0)));
      else if (xml->name == "Flatten"                ) node = state.sceneMap[id] = flatten(loadNode(xml->child(0)), SceneGraph::INSTANCING_NONE);
      else if (xml->name == "TimeRange"              ) {
        const Vec2f time_range = xml->parm_Vec2f("time");
        node = state.sceneMap[id] = loadNode(xml->child(0));
        set_time_range(node,BBox1f(time_range.x,time_range.y));
      }

      else if (xml->name == "FurBall") node = state.sceneMap[id] = loadFurBall(xml);

      else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);

      node->name = xml->parm("name");
      return node;
    }

    return nullptr;
  }